

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O1

void optimization::loop_unrolling::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  iterator __position;
  pointer pVVar1;
  MirFunction *pMVar2;
  BasicBlk *pBVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  LabelId LVar7;
  int iVar8;
  pointer puVar9;
  VarId *pVVar10;
  Inst *pIVar11;
  undefined8 uVar12;
  loop_info *plVar13;
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  *p_Var14;
  Displayable DVar15;
  char cVar16;
  int iVar17;
  _Self __tmp_2;
  mapped_type *pmVar18;
  pointer puVar19;
  long *plVar20;
  pointer pVVar21;
  long lVar22;
  _Rb_tree_node_base *p_Var23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  undefined4 extraout_var;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var26;
  OpInst *this;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var27;
  uint32_t *puVar28;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  _Self __tmp_1;
  char *pcVar31;
  Tag *pTVar32;
  pointer *__ptr;
  pointer puVar33;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar34;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<mir::inst::VarId> __l_02;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  int extra_loop;
  VarId new_phi;
  Rewriter rwt;
  size_type __dnew_2;
  VarId cond;
  int extra_loop_start;
  VarId new_change_var;
  undefined1 local_2d8 [17];
  undefined6 uStack_2c7;
  undefined4 uStack_2c1;
  undefined1 uStack_2bd;
  undefined4 uStack_2bc;
  undefined1 local_2b8 [24];
  undefined8 uStack_2a0;
  BasicBlk *local_290;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_288;
  loop_info *local_280;
  allocator_type local_271;
  LabelId *local_270;
  int local_264;
  mapped_type *local_260;
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  *local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [17];
  undefined6 uStack_22f;
  undefined1 uStack_229;
  undefined1 auStack_228 [16];
  pair<mir::inst::Op,_int> local_218;
  pair<mir::inst::Op,_int> local_210;
  size_t local_208;
  undefined **local_200;
  uint32_t local_1f8;
  undefined **local_1f0;
  uint32_t local_1e8;
  undefined **local_1e0;
  uint32_t local_1d8;
  int local_1d0;
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  undefined1 local_1b0 [16];
  _Alloc_hider local_1a0;
  _Base_ptr local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [9];
  undefined2 local_177;
  Op local_170;
  undefined1 local_130 [24];
  undefined1 local_118 [16];
  Displayable local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  _Alloc_hider _Stack_f0;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> local_e8;
  undefined1 auStack_e0 [16];
  pointer local_d0;
  pointer puStack_c8;
  undefined **local_c0;
  JumpInstructionKind local_b8;
  bool local_a0;
  undefined8 local_98;
  JumpKind local_90;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_80;
  VarId local_78;
  undefined1 local_68;
  VarId *local_60;
  MirFunction *local_58;
  undefined **local_50;
  uint32_t local_48;
  undefined **local_40;
  uint32_t local_38;
  
  pTVar32 = (Tag *)&info->loop_start;
  local_280 = info;
  local_270 = (LabelId *)pTVar32;
  pmVar18 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(&func->basic_blks,(key_type *)pTVar32);
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar32);
  local_118._8_8_ = &aStack_100;
  local_118._0_8_ = &PTR__Tag_001edee0;
  local_108._vptr_Displayable = (_func_int **)0x0;
  aStack_100._M_allocated_capacity = aStack_100._M_allocated_capacity & 0xffffffffffffff00;
  _Stack_f0._M_p._0_1_ = 1;
  AixLog::operator<<((ostream *)local_118,pTVar32);
  local_2b8._8_8_ = std::chrono::_V2::system_clock::now();
  local_2b8._0_8_ = &PTR__Timestamp_001edeb0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)local_2b8,(Timestamp *)pTVar32);
  pMVar2 = (MirFunction *)(local_240 + 0x10);
  local_240[0x10] = 0x65;
  uStack_22f = 0x5f646e617078;
  uStack_229 = 0x6c;
  auStack_228[0] = 0x6f;
  auStack_228._1_2_ = 0x706f;
  local_240._8_8_ = (BasicBlk *)0xb;
  auStack_228[3] = _S_red >> 0x18;
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)0x6a;
  local_290 = blk;
  local_240._0_8_ = pMVar2;
  local_58 = func;
  puVar19 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)&local_78);
  DVar15._vptr_Displayable = local_78.super_Displayable._vptr_Displayable;
  local_2d8[0x10] = SUB81(local_78.super_Displayable._vptr_Displayable,0);
  uStack_2c7 = (undefined6)((ulong)local_78.super_Displayable._vptr_Displayable >> 8);
  uStack_2c1._0_1_ = (undefined1)((ulong)local_78.super_Displayable._vptr_Displayable >> 0x38);
  pcVar31 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2d8._0_8_ = puVar19;
  memcpy(puVar19,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  *(undefined1 *)
   ((long)&(puVar19->_M_t).
           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
           super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
   (long)DVar15._vptr_Displayable) = 0;
  local_1c8._0_8_ = &PTR__Function_001edf10;
  if ((MirFunction *)local_240._0_8_ == pMVar2) {
    local_1b0._8_8_ =
         CONCAT44(auStack_228._4_4_,
                  CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])));
    local_1c8._8_8_ = local_1b0;
  }
  else {
    local_1c8._8_8_ = local_240._0_8_;
  }
  local_1b0._1_6_ = uStack_22f;
  local_1b0[0] = local_240[0x10];
  local_1b0[7] = uStack_229;
  local_1b8 = (_Base_ptr)local_240._8_8_;
  local_240._8_8_ = (BasicBlk *)0x0;
  local_240[0x10] = Add;
  if ((pointer)local_2d8._0_8_ == (pointer)(local_2d8 + 0x10)) {
    local_190._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_1a0._M_p = (pointer)local_190;
  }
  else {
    local_1a0._M_p = (pointer)local_2d8._0_8_;
  }
  local_190._1_6_ = uStack_2c7;
  local_190[0] = local_2d8[0x10];
  local_190[7] = (undefined1)uStack_2c1;
  local_198 = (_Base_ptr)DVar15._vptr_Displayable;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  local_180._0_8_ = (pointer)0x13e;
  local_180[8] = false;
  local_2d8._0_8_ = (pointer)(local_2d8 + 0x10);
  local_240._0_8_ = pMVar2;
  AixLog::operator<<((ostream *)local_1c8,(Function *)pcVar31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"unroll loop starts at  ",0x17);
  plVar20 = (long *)std::ostream::operator<<(&std::clog,*local_270);
  cVar16 = std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
  pTVar32 = (Tag *)(ulong)(uint)(int)cVar16;
  std::ostream::put((char)plVar20);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1c8);
  if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
    pTVar32 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar32);
  }
  if ((MirFunction *)local_240._0_8_ != pMVar2) {
    pTVar32 = (Tag *)(CONCAT17(uStack_229,CONCAT61(uStack_22f,local_240[0x10])) + 1);
    operator_delete((void *)local_240._0_8_,(ulong)pTVar32);
  }
  local_118._0_8_ = &PTR__Tag_001edee0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &aStack_100) {
    pTVar32 = (Tag *)(aStack_100._M_allocated_capacity + 1);
    operator_delete((void *)local_118._8_8_,(ulong)pTVar32);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar32);
  local_118._0_8_ = &PTR__Tag_001edee0;
  local_118._8_8_ = &aStack_100;
  local_108._vptr_Displayable = (_func_int **)0x0;
  aStack_100._M_allocated_capacity = aStack_100._M_allocated_capacity & 0xffffffffffffff00;
  _Stack_f0._M_p._0_1_ = 1;
  AixLog::operator<<((ostream *)local_118,pTVar32);
  local_2b8._8_8_ = std::chrono::_V2::system_clock::now();
  local_2b8._0_8_ = &PTR__Timestamp_001edeb0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)local_2b8,(Timestamp *)pTVar32);
  local_240[0x10] = 0x65;
  uStack_22f = 0x5f646e617078;
  uStack_229 = 0x6c;
  auStack_228[0] = 0x6f;
  auStack_228._1_2_ = 0x706f;
  local_240._8_8_ = (BasicBlk *)0xb;
  auStack_228[3] = _S_red >> 0x18;
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)0x6a;
  local_260 = pmVar18;
  local_240._0_8_ = pMVar2;
  puVar19 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)&local_78);
  DVar15._vptr_Displayable = local_78.super_Displayable._vptr_Displayable;
  local_2d8[0x10] = SUB81(local_78.super_Displayable._vptr_Displayable,0);
  uStack_2c7 = (undefined6)((ulong)local_78.super_Displayable._vptr_Displayable >> 8);
  uStack_2c1._0_1_ = (undefined1)((ulong)local_78.super_Displayable._vptr_Displayable >> 0x38);
  pcVar31 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2d8._0_8_ = puVar19;
  memcpy(puVar19,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  plVar13 = local_280;
  *(undefined1 *)
   ((long)&(puVar19->_M_t).
           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
           super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
   (long)DVar15._vptr_Displayable) = 0;
  local_1c8._0_8_ = &PTR__Function_001edf10;
  if ((MirFunction *)local_240._0_8_ == pMVar2) {
    local_1b0._8_8_ =
         CONCAT44(auStack_228._4_4_,
                  CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])));
    local_1c8._8_8_ = local_1b0;
  }
  else {
    local_1c8._8_8_ = local_240._0_8_;
  }
  local_1b0._1_6_ = uStack_22f;
  local_1b0[0] = local_240[0x10];
  local_1b0[7] = uStack_229;
  local_1b8 = (_Base_ptr)local_240._8_8_;
  local_240._8_8_ = (BasicBlk *)0x0;
  local_240[0x10] = Add;
  if ((pointer)local_2d8._0_8_ == (pointer)(local_2d8 + 0x10)) {
    local_190._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_1a0._M_p = (pointer)local_190;
  }
  else {
    local_1a0._M_p = (pointer)local_2d8._0_8_;
  }
  local_190._1_6_ = uStack_2c7;
  local_190[0] = local_2d8[0x10];
  local_190[7] = (undefined1)uStack_2c1;
  local_198 = (_Base_ptr)DVar15._vptr_Displayable;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  local_180._0_8_ = (pointer)0x13f;
  local_180[8] = false;
  local_2d8._0_8_ = (pointer)(local_2d8 + 0x10);
  local_240._0_8_ = pMVar2;
  AixLog::operator<<((ostream *)local_1c8,(Function *)pcVar31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"init_val: ",10);
  (**(plVar13->init_var).super_Displayable._vptr_Displayable)(&plVar13->init_var,&std::clog);
  cVar16 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar32 = (Tag *)(ulong)(uint)(int)cVar16;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1c8);
  if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
    pTVar32 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar32);
  }
  if ((MirFunction *)local_240._0_8_ != pMVar2) {
    pTVar32 = (Tag *)(CONCAT17(uStack_229,CONCAT61(uStack_22f,local_240[0x10])) + 1);
    operator_delete((void *)local_240._0_8_,(ulong)pTVar32);
  }
  local_118._0_8_ = &PTR__Tag_001edee0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &aStack_100) {
    pTVar32 = (Tag *)(aStack_100._M_allocated_capacity + 1);
    operator_delete((void *)local_118._8_8_,(ulong)pTVar32);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar32);
  local_240._8_8_ = auStack_228;
  local_240._0_8_ = &PTR__Tag_001edee0;
  local_240[0x10] = Add;
  uStack_22f = 0;
  uStack_229 = 0;
  auStack_228[0] = _S_red;
  local_218.first._0_1_ = 1;
  AixLog::operator<<((ostream *)local_240,pTVar32);
  local_258 = (_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
               *)&func->basic_blks;
  local_78._8_8_ = std::chrono::_V2::system_clock::now();
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001edeb0;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)pTVar32);
  paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2d8 + 0x10);
  local_2d8[0x10] = 0x65;
  uStack_2c7 = 0x5f646e617078;
  uStack_2c1 = 0x706f6f6c;
  local_2d8._8_8_ = (pointer)0xb;
  uStack_2bd = 0;
  pVVar1 = (pointer)(local_2b8 + 0x10);
  local_1c8._0_8_ = (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x6a;
  local_2d8._0_8_ = paVar30;
  local_2b8._0_8_ = pVVar1;
  local_60 = &plVar13->init_var;
  pVVar21 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1c8);
  uVar12 = local_1c8._0_8_;
  local_2b8._16_8_ = local_1c8._0_8_;
  pcVar31 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2b8._0_8_ = pVVar21;
  memcpy(pVVar21,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  *(undefined1 *)((long)&(pVVar21->super_Displayable)._vptr_Displayable + uVar12) = 0;
  local_118._0_8_ = &PTR__Function_001edf10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ == paVar30) {
    aStack_100._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_118._8_8_ = &aStack_100;
  }
  else {
    local_118._8_8_ = local_2d8._0_8_;
  }
  aStack_100._M_allocated_capacity._1_6_ = uStack_2c7;
  aStack_100._M_local_buf[0] = local_2d8[0x10];
  aStack_100._M_local_buf[7] = (undefined1)uStack_2c1;
  _Stack_f0._M_p = auStack_e0;
  local_108._vptr_Displayable = (_func_int **)local_2d8._8_8_;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  if ((pointer)local_2b8._0_8_ == pVVar1) {
    auStack_e0._8_8_ = uStack_2a0;
  }
  else {
    _Stack_f0._M_p = (pointer)local_2b8._0_8_;
  }
  auStack_e0._0_8_ = local_2b8._16_8_;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)uVar12;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  local_d0 = (pointer)0x140;
  puStack_c8 = (pointer)((ulong)puStack_c8 & 0xffffffffffffff00);
  local_2d8._0_8_ = paVar30;
  local_2b8._0_8_ = pVVar1;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"change : ",9);
  uVar6 = (plVar13->init_var).id;
  local_170 = (plVar13->change).first;
  local_1c8._8_8_ = &PTR_display_001ee058;
  local_1b8 = (_Base_ptr)CONCAT44(local_1b8._4_4_,uVar6);
  local_1c8._0_8_ = &PTR_display_001f0078;
  local_1b0._8_8_ = &PTR_display_001ee058;
  local_1a0._M_p._0_4_ = uVar6;
  local_1b0._0_8_ = &PTR_display_001effc8;
  local_198 = (_Base_ptr)CONCAT53(local_198._3_5_,0x101);
  local_180[8] = false;
  local_190._8_4_ = (plVar13->change).second;
  local_80._M_head_impl = (Inst *)&PTR_display_001effc8;
  local_190._0_8_ = &PTR_display_001effc8;
  local_177._0_1_ = Lsl;
  local_177._1_1_ = '\0';
  mir::inst::OpInst::display((OpInst *)local_1c8,(ostream *)&std::clog);
  cVar16 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar32 = (Tag *)(ulong)(uint)(int)cVar16;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  if ((pointer)local_2b8._0_8_ != pVVar1) {
    pTVar32 = (Tag *)((long)&((Displayable *)local_2b8._16_8_)->_vptr_Displayable + 1);
    operator_delete((void *)local_2b8._0_8_,(ulong)pTVar32);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2d8 + 0x10)) {
    pTVar32 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar32);
  }
  local_240._0_8_ = &PTR__Tag_001edee0;
  if ((BasicBlk *)local_240._8_8_ != (BasicBlk *)auStack_228) {
    pTVar32 = (Tag *)(CONCAT44(auStack_228._4_4_,
                               CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])))
                     + 1);
    operator_delete((void *)local_240._8_8_,(ulong)pTVar32);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar32);
  local_240._0_8_ = &PTR__Tag_001edee0;
  local_240._8_8_ = auStack_228;
  local_240[0x10] = Add;
  uStack_22f = 0;
  uStack_229 = 0;
  auStack_228[0] = _S_red;
  local_218.first._0_1_ = 1;
  AixLog::operator<<((ostream *)local_240,pTVar32);
  local_78._8_8_ = std::chrono::_V2::system_clock::now();
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001edeb0;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)pTVar32);
  paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2d8 + 0x10);
  local_2d8[0x10] = 0x65;
  uStack_2c7 = 0x5f646e617078;
  uStack_2c1 = 0x706f6f6c;
  local_2d8._8_8_ = (pointer)0xb;
  uStack_2bd = 0;
  local_1c8._0_8_ = (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x6a;
  local_2d8._0_8_ = paVar30;
  local_2b8._0_8_ = pVVar1;
  pVVar21 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1c8);
  uVar12 = local_1c8._0_8_;
  local_2b8._16_8_ = local_1c8._0_8_;
  pcVar31 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2b8._0_8_ = pVVar21;
  memcpy(pVVar21,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  p_Var14 = local_258;
  plVar13 = local_280;
  *(undefined1 *)((long)&(pVVar21->super_Displayable)._vptr_Displayable + uVar12) = 0;
  local_118._0_8_ = &PTR__Function_001edf10;
  local_118._8_8_ = &aStack_100;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ == paVar30) {
    aStack_100._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
  }
  else {
    local_118._8_8_ = local_2d8._0_8_;
  }
  aStack_100._M_allocated_capacity._1_6_ = uStack_2c7;
  aStack_100._M_local_buf[0] = local_2d8[0x10];
  aStack_100._M_local_buf[7] = (undefined1)uStack_2c1;
  _Stack_f0._M_p = auStack_e0;
  local_108._vptr_Displayable = (_func_int **)local_2d8._8_8_;
  local_2d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2d8[0x10] = 0;
  if ((pointer)local_2b8._0_8_ == pVVar1) {
    auStack_e0._8_8_ = uStack_2a0;
  }
  else {
    _Stack_f0._M_p = (pointer)local_2b8._0_8_;
  }
  auStack_e0._0_8_ = local_2b8._16_8_;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)uVar12;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  local_d0 = (pointer)0x144;
  puStack_c8 = (pointer)((ulong)puStack_c8 & 0xffffffffffffff00);
  local_2d8._0_8_ = paVar30;
  local_2b8._0_8_ = pVVar1;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"continue when: ",0xf);
  local_170 = (plVar13->cmp).first;
  local_1c8._8_8_ = &PTR_display_001ee058;
  local_1b8 = (_Base_ptr)((ulong)local_1b8 & 0xffffffff00000000);
  local_1c8._0_8_ = &PTR_display_001f0078;
  local_1b0._8_8_ = &PTR_display_001ee058;
  local_1a0._M_p._0_4_ = (plVar13->init_var).id;
  local_1b0._0_8_ = local_80._M_head_impl;
  local_198 = (_Base_ptr)CONCAT53(local_198._3_5_,0x101);
  local_180[8] = true;
  local_190._8_8_ = &PTR_display_001ee058;
  local_180._0_4_ = (plVar13->cmp).second.id;
  local_190._0_8_ = local_80._M_head_impl;
  local_177._0_1_ = Lsl;
  local_177._1_1_ = '\0';
  mir::inst::OpInst::display((OpInst *)local_1c8,(ostream *)&std::clog);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  pBVar3 = local_290;
  if ((pointer)local_2b8._0_8_ != pVVar1) {
    operator_delete((void *)local_2b8._0_8_,
                    (ulong)((long)&((Displayable *)local_2b8._16_8_)->_vptr_Displayable + 1));
  }
  pMVar2 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_,
                    CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
  }
  local_240._0_8_ = &PTR__Tag_001edee0;
  if ((BasicBlk *)local_240._8_8_ != (BasicBlk *)auStack_228) {
    operator_delete((void *)local_240._8_8_,
                    CONCAT44(auStack_228._4_4_,
                             CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0]))) +
                    1);
  }
  local_1e8 = (plVar13->init_var).id;
  local_1f8 = (plVar13->phi_var).id;
  local_1d8 = (plVar13->change_var).id;
  local_240._0_8_ = pMVar2;
  local_240._8_8_ = pBVar3;
  auStack_228[0] = _S_red;
  auStack_228._1_2_ = _S_red >> 8;
  auStack_228[3] = _S_red >> 0x18;
  auStack_228._8_8_ = (_Base_ptr)0x0;
  local_218 = (pair<mir::inst::Op,_int>)auStack_228;
  local_208 = 0;
  local_200 = &PTR_display_001ee058;
  local_1f0 = &PTR_display_001ee058;
  local_1e0 = &PTR_display_001ee058;
  local_210 = local_218;
  lVar22 = std::_Rb_tree_decrement
                     (&(pMVar2->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  local_1d0 = *(int *)(lVar22 + 0x20);
  pmVar18 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var14,local_270);
  loop_info::rewrite_jump_cond(plVar13,pmVar18);
  p_Var23 = (_Rb_tree_node_base *)
            std::_Rb_tree_decrement
                      (&(pMVar2->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header);
  lVar22 = std::_Rb_tree_decrement(p_Var23);
  local_130._20_4_ = *(int *)(lVar22 + 0x20) + Sub;
  local_264 = *(int *)(lVar22 + 0x20) + 2;
  local_118._0_8_ = &PTR_display_001f0478;
  aStack_100._8_8_ = 0;
  local_108._vptr_Displayable = (_func_int **)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  auStack_e0._0_8_ = 0;
  auStack_e0._8_8_ = 0;
  local_c0 = &PTR_display_001f0438;
  local_b8 = Undefined;
  local_a0 = false;
  local_98._0_4_ = -1;
  local_98._4_4_ = -1;
  local_90 = Undefined;
  _Stack_f0._M_p = (pointer)&aStack_100;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)&aStack_100;
  local_118._8_4_ = local_130._20_4_;
  local_1c8._0_4_ = local_130._20_4_;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)(local_1c8 + 8),(BasicBlk *)local_118);
  p_Var14 = local_258;
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            (local_258,(pair<const_int,_mir::inst::BasicBlk> *)local_1c8);
  local_1c8._8_8_ = &PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_180);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1b0);
  local_118._0_8_ = &PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)(auStack_e0 + 8));
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_108);
  local_118._0_8_ = &PTR_display_001f0478;
  local_118._8_4_ = local_264;
  aStack_100._8_8_ = 0;
  local_108._vptr_Displayable = (_func_int **)0x0;
  aStack_100._M_allocated_capacity = 0;
  _Stack_f0._M_p = (pointer)&aStack_100;
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  auStack_e0._0_8_ = 0;
  auStack_e0._8_8_ = 0;
  local_c0 = &PTR_display_001f0438;
  local_b8 = Undefined;
  local_a0 = false;
  local_98._0_4_ = -1;
  local_98._4_4_ = -1;
  local_90 = Undefined;
  local_1c8._0_4_ = local_264;
  pBVar3 = (BasicBlk *)(local_1c8 + 8);
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)_Stack_f0._M_p;
  mir::inst::BasicBlk::BasicBlk(pBVar3,(BasicBlk *)local_118);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            (p_Var14,(pair<const_int,_mir::inst::BasicBlk> *)local_1c8);
  local_1c8._8_8_ = &PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_180);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1b0);
  local_118._0_8_ = &PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)(auStack_e0 + 8));
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_108);
  pmVar24 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var14,(key_type *)(local_130 + 0x14));
  pmVar18 = local_260;
  pmVar25 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var14,&local_264);
  local_118._4_4_ = local_290->id;
  local_118._0_4_ = pmVar18->id;
  __l._M_len = 2;
  __l._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8,__l,(less<int> *)local_2d8,
             (allocator_type *)local_2b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar24->preceding)._M_t);
  if (local_1b8 != (_Base_ptr)0x0) {
    (pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1c8._8_4_;
    (pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1b8;
    (pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1b0._0_8_;
    (pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1b0._8_8_;
    local_1b8->_M_parent = &(pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar24->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_1a0._M_p;
    local_1b8 = (_Base_ptr)0x0;
    local_1a0._M_p = (pointer)0x0;
    local_1b0._0_8_ = pBVar3;
    local_1b0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1c8);
  local_118._4_4_ = pmVar25->id;
  local_118._0_4_ = pmVar24->id;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8,__l_00,
             (less<int> *)local_2d8,(allocator_type *)local_2b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar25->preceding)._M_t);
  if (local_1b8 != (_Base_ptr)0x0) {
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1c8._8_4_;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1b8;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1b0._0_8_;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1b0._8_8_;
    local_1b8->_M_parent = &(pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_1a0._M_p;
    local_1b8 = (_Base_ptr)0x0;
    local_1a0._M_p = (pointer)0x0;
    local_1b0._0_8_ = pBVar3;
    local_1b0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1c8);
  local_118._4_4_ = pmVar25->id;
  local_118._0_4_ = pmVar24->id;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1c8,__l_01,
             (less<int> *)local_2d8,(allocator_type *)local_2b8);
  local_270 = &(pmVar18->jump).bb_false;
  pmVar18 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var14,local_270);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar18->preceding)._M_t);
  if (local_1b8 != (_Base_ptr)0x0) {
    (pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1c8._8_4_;
    (pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1b8;
    (pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1b0._0_8_;
    (pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1b0._8_8_;
    local_1b8->_M_parent = &(pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar18->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_1a0._M_p;
    local_1b8 = (_Base_ptr)0x0;
    local_1a0._M_p = (pointer)0x0;
    local_1b0._0_8_ = pBVar3;
    local_1b0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1c8);
  puVar19 = (local_290->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (local_290->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar9) {
    do {
      local_1c8._0_4_ =
           (*(((puVar19->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
             _vptr_Displayable[6])();
      local_1c8._4_4_ = extraout_var;
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)&pmVar25->inst,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_1c8);
      if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_1c8._0_8_
          != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
        (**(code **)(*(_func_int **)local_1c8._0_8_ + 0x28))();
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar9);
  }
  pmVar18 = local_260;
  LVar7 = pmVar25->id;
  iVar17 = *local_270;
  bVar4 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  uVar6 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  (pmVar25->jump).kind = BrCond;
  bVar5 = (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  if ((bVar5 & bVar4) == 0) {
    if ((bVar4 & 1U) == 0) {
      if (bVar5 != false) {
        (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
      }
    }
    else {
      (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar6;
      (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
  }
  else {
    (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar6;
  }
  (pmVar25->jump).bb_true = LVar7;
  (pmVar25->jump).bb_false = iVar17;
  (pmVar25->jump).jump_kind = Loop;
  loop_info::rewrite_jump_cond(local_280,local_290);
  plVar13 = local_280;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  local_78.id = 0xffffffff;
  Rewriter::get_insts((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)local_2d8,(Rewriter *)local_240,local_280->unrolling_times,&local_78);
  local_40 = &PTR_display_001ee058;
  local_38 = (plVar13->init_var).id;
  loop_info::copy_var((loop_info *)local_250,(VarId *)plVar13);
  local_1c8._0_8_ = &PTR_display_001ee058;
  local_1c8._8_4_ = (plVar13->init_var).id;
  local_1b8 = (_Base_ptr)&PTR_display_001ee058;
  local_1b0._0_4_ = local_78.id;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1c8;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8,__l_02,
             &local_271);
  _Var26._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)operator_new(0x40);
  local_118._0_8_ = local_2b8._0_8_;
  local_118._8_8_ = local_2b8._8_8_;
  local_108._vptr_Displayable = (_func_int **)local_2b8._16_8_;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  *(undefined ***)
   ((long)_Var26._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) = &PTR_display_001ee058;
  *(undefined4 *)
   ((long)_Var26._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = local_250._8_4_;
  *(undefined ***)
   _Var26._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = &PTR_display_001f03d8;
  *(undefined ***)
   ((long)_Var26._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18) =
       &PTR_display_001ee058;
  *(undefined4 *)
   ((long)_Var26._M_t.
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20) = local_250._8_4_;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             ((long)_Var26._M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x28),
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_118);
  local_288._M_head_impl =
       (Inst *)_Var26._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
  if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_118._0_8_,(long)local_108._vptr_Displayable - local_118._0_8_);
  }
  local_130._0_8_ = local_288._M_head_impl;
  local_288._M_head_impl = (Inst *)0x0;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&pmVar24->inst,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_130);
  if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)local_130._0_8_ !=
      (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
    (*((Displayable *)local_130._0_8_)->_vptr_Displayable[5])();
  }
  local_130._0_8_ = (Inst *)0x0;
  if ((PhiInst *)local_288._M_head_impl != (PhiInst *)0x0) {
    std::default_delete<mir::inst::PhiInst>::operator()
              ((default_delete<mir::inst::PhiInst> *)&local_288,(PhiInst *)local_288._M_head_impl);
  }
  local_288._M_head_impl = (Inst *)0x0;
  if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  if ((local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  local_50 = &PTR_display_001ee058;
  local_48 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
             _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  loop_info::copy_var((loop_info *)local_130,(VarId *)local_280);
  this = (OpInst *)operator_new(0x60);
  local_2b8._0_8_ = &PTR_display_001ee058;
  local_2b8._8_4_ = local_130._8_4_;
  local_1c8._8_8_ = &PTR_display_001ee058;
  local_1b8 = (_Base_ptr)CONCAT44(local_1b8._4_4_,local_250._8_4_);
  local_1c8._0_8_ = local_80._M_head_impl;
  local_1b0._0_3_ = 0x101;
  local_118._8_8_ = &PTR_display_001ee058;
  local_108._vptr_Displayable._0_4_ = (local_280->cmp).second.id;
  local_118._0_8_ = local_80._M_head_impl;
  aStack_100._M_allocated_capacity._0_3_ = 0x101;
  mir::inst::OpInst::OpInst
            (this,(VarId *)local_2b8,(Value *)local_1c8,(Value *)local_118,(local_280->cmp).first);
  local_288._M_head_impl = (Inst *)this;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&pmVar24->inst,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&local_288);
  pBVar3 = local_290;
  if ((OpInst *)local_288._M_head_impl != (OpInst *)0x0) {
    (*(((Inst *)&(local_288._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [5])();
  }
  iVar17 = pmVar25->id;
  iVar8 = *local_270;
  (pmVar24->jump).kind = BrCond;
  if ((pmVar24->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    (pmVar24->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_130._8_4_;
  }
  else {
    (pmVar24->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    (pmVar24->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_130._8_4_;
    (pmVar24->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  (pmVar24->jump).bb_true = iVar17;
  (pmVar24->jump).bb_false = iVar8;
  (pmVar24->jump).jump_kind = Loop;
  if ((pBVar3->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  LVar7 = pmVar24->id;
  (pBVar3->jump).kind = BrCond;
  (pBVar3->jump).bb_true = pBVar3->id;
  (pBVar3->jump).bb_false = LVar7;
  (pBVar3->jump).jump_kind = Loop;
  _Var26._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (((pmVar25->inst).
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t;
  iVar17 = (**(code **)(*(long *)_Var26._M_t.
                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))
                     (_Var26._M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl);
  if (iVar17 != 7) {
    __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                  ,0x180,
                  "void optimization::loop_unrolling::expand_loop(mir::inst::MirFunction &, mir::inst::BasicBlk &, loop_info)"
                 );
  }
  _Var29._M_head_impl = (Inst *)0x0;
  if (*(undefined ***)
       _Var26._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
       super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl == &PTR_display_001f03d8) {
    _Var29._M_head_impl =
         (Inst *)_Var26._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
  }
  _Var27 = std::
           __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                     (*(long *)&_Var29._M_head_impl[1].dest.id,
                      *(long *)&_Var29._M_head_impl[2].super_Displayable,local_60);
  p_Var14 = local_258;
  pBVar3 = local_290;
  pVVar10 = *(VarId **)&_Var29._M_head_impl[2].super_Displayable;
  if ((_Var27._M_current + 1 != pVVar10) &&
     (lVar22 = (long)pVVar10 - (long)(_Var27._M_current + 1) >> 4, 0 < lVar22)) {
    lVar22 = lVar22 + 1;
    puVar28 = &_Var27._M_current[1].id;
    do {
      puVar28[-4] = *puVar28;
      lVar22 = lVar22 + -1;
      puVar28 = puVar28 + 4;
    } while (1 < lVar22);
  }
  __position._M_current = pVVar10 + -1;
  _Var29._M_head_impl[2].super_Displayable = (Displayable)__position._M_current;
  if (__position._M_current == *(VarId **)&_Var29._M_head_impl[2].dest.super_Displayable) {
    std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
    _M_realloc_insert<mir::inst::VarId_const&>
              ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
               &_Var29._M_head_impl[1].dest.id,__position,(VarId *)local_250);
  }
  else {
    pVVar10[-1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    pVVar10[-1].id = local_250._8_4_;
    _Var29._M_head_impl[2].super_Displayable = (Displayable)pVVar10;
  }
  puVar19 = (pBVar3->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (pBVar3->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar33 = puVar19;
  if (puVar9 != puVar19) {
    do {
      pIVar11 = (puVar33->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar11 != (Inst *)0x0) {
        (*(pIVar11->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar33->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar33 = puVar33 + 1;
    } while (puVar33 != puVar9);
    (local_290->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar19;
    pmVar18 = local_260;
  }
  uVar12 = local_2d8._8_8_;
  if (local_2d8._0_8_ != local_2d8._8_8_) {
    local_290 = (BasicBlk *)&local_290->inst;
    paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._0_8_;
    do {
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)local_290,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 &paVar30->_M_allocated_capacity);
      paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar30->_M_allocated_capacity + 1);
    } while (paVar30 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar12);
  }
  pmVar25 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var14,local_270);
  pVar34 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&(pmVar25->preceding)._M_t,&(pmVar18->jump).bb_true);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&(pmVar25->preceding)._M_t,(_Base_ptr)pVar34.first._M_node,
             (_Base_ptr)pVar34.second._M_node);
  if ((pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  iVar17 = pmVar24->id;
  (pmVar18->jump).kind = BrCond;
  (pmVar18->jump).bb_false = iVar17;
  (pmVar18->jump).jump_kind = Undefined;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_2d8);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)(local_240 + 0x10));
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "unroll loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: " << info.init_var << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var, info.init_var,
                                  info.change.second, info.change.first)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var,
                                  info.cmp.second, info.cmp.first)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var}, info.change_var);
  info.rewrite_jump_cond(func.basic_blks.at(info.loop_start));

  auto end_iter = func.basic_blks.end();
  end_iter--;
  end_iter--;

  // extra loop
  auto extra_loop_start = end_iter->first + 1;
  auto extra_loop = end_iter->first + 2;
  func.basic_blks.insert(
      {extra_loop_start, mir::inst::BasicBlk(extra_loop_start)});
  func.basic_blks.insert({extra_loop, mir::inst::BasicBlk(extra_loop)});
  auto& extra_loop_start_blk = func.basic_blks.at(extra_loop_start);
  auto& extra_loop_blk = func.basic_blks.at(extra_loop);
  extra_loop_start_blk.preceding =
      std::set<mir::types::LabelId>{loop_start.id, blk.id};
  extra_loop_blk.preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // original loop's end
  func.basic_blks.at(loop_start.jump.bb_false).preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // copy original loop insts in extra loop blk
  for (auto& inst : blk.inst) {
    extra_loop_blk.inst.push_back(
        std::unique_ptr<mir::inst::Inst>(inst->deep_copy()));
  }
  extra_loop_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, blk.jump.cond_or_ret,
      mir::inst::JumpKind::Loop);

  // after copy then can be rewrrote
  info.rewrite_jump_cond(blk);

  // init extra loop start 's insts
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  auto new_phi = info.copy_var(info.init_var);
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
      new_phi, std::vector<mir::inst::VarId>{info.init_var, new_change_var}));
  auto cond = info.copy_var(blk.jump.cond_or_ret.value());
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
      cond, new_phi, info.cmp.second, info.cmp.first));
  extra_loop_start_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, cond, mir::inst::JumpKind::Loop);

  blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, blk.id, extra_loop_start_blk.id,
      blk.jump.cond_or_ret.value(), mir::inst::JumpKind::Loop);
  auto& inst = extra_loop_blk.inst.front();
  auto& i = *inst;
  assert(inst->inst_kind() == mir::inst::InstKind::Phi);
  auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  phiInst->vars.erase(
      std::find(phiInst->vars.begin(), phiInst->vars.end(), info.init_var));
  phiInst->vars.push_back(new_phi);
  blk.inst.clear();
  for (auto& inst : insts) {
    blk.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, loop_start.jump.bb_true,
      extra_loop_start_blk.id, loop_start.jump.cond_or_ret.value());
  // auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  // for (auto iter = end_loop_blk.inst.begin();
  //      iter != end_loop_blk.inst.end() &&
  //      iter->get()->inst_kind() == mir::inst::InstKind::Phi;
  //      iter++) {
  //   auto& inst = *iter;
  //   auto& i = *inst;
  //   auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  //   if (phiInst->useVars().count(info.change_var)) {
  //     phiInst->vars.erase(std::find(phiInst->vars.begin(),
  //     phiInst->vars.end(),
  //                                   info.change_var));
  //   }
  //   if (times) {
  //     if (phiInst->useVars().count(info.init_var)) {
  //       phiInst->vars.erase(std::find(
  //           phiInst->vars.begin(), phiInst->vars.end(),
  //           info.init_var));
  //       phiInst->vars.push_back(new_change_var);
  //     }
  //   }
  // }
}